

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_stats.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  revision_opt *this;
  exception *ex;
  database db;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  char **ppcStack_18;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"Dumps statistics for the indexes in a pstore database",&local_41);
  pstore::command_line::parse_command_line_options(argc,argv,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  path = pstore::command_line::
         opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
         ::get((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                *)(anonymous_namespace)::db_path_abi_cxx11_);
  pstore::database::database((database *)&ex,path,read_only,true);
  this = pstore::command_line::
         opt<pstore::command_line::revision_opt,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
         ::get((opt<pstore::command_line::revision_opt,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                *)(anonymous_namespace)::revision_abi_cxx11_);
  pstore::command_line::revision_opt::operator_cast_to_unsigned_int(this);
  pstore::database::sync((database *)&ex);
  std::operator<<((ostream *)&std::cout,"name,branching-factor,mean-leaf-depth,max-depth,size\n");
  anon_unknown.dwarf_eff0::dump_index_stats<(pstore::trailer::indices)0>((database *)&ex);
  anon_unknown.dwarf_eff0::dump_index_stats<(pstore::trailer::indices)1>((database *)&ex);
  anon_unknown.dwarf_eff0::dump_index_stats<(pstore::trailer::indices)2>((database *)&ex);
  anon_unknown.dwarf_eff0::dump_index_stats<(pstore::trailer::indices)3>((database *)&ex);
  anon_unknown.dwarf_eff0::dump_index_stats<(pstore::trailer::indices)4>((database *)&ex);
  anon_unknown.dwarf_eff0::dump_index_stats<(pstore::trailer::indices)5>((database *)&ex);
  pstore::database::~database((database *)&ex);
  return local_1c;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    PSTORE_TRY {
        command_line::parse_command_line_options (
            argc, argv, "Dumps statistics for the indexes in a pstore database");

        database db{db_path.get (), database::access_mode::read_only};
        db.sync (static_cast<unsigned> (revision.get ()));

        command_line::out_stream << PSTORE_NATIVE_TEXT (
            "name,branching-factor,mean-leaf-depth,max-depth,size\n");
#define X(a) dump_index_stats<trailer::indices::a> (db);
        PSTORE_INDICES
#undef X
    }